

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O1

void __thiscall
JobManagerTestSuite::SetInitialExpectations(JobManagerTestSuite *this,TestContext *aContext)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  undefined8 uVar3;
  _func_int **pp_Var4;
  int iVar5;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar6;
  _func_int *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_100;
  _Any_data local_e8;
  code *local_d8;
  Matcher<const_ot::commissioner::Config_&> local_c8;
  undefined8 local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_a0;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  TestContext *local_58;
  Error local_50;
  
  peVar2 = (aContext->mPS).
           super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_e8._M_pod_data[0] = peVar2 != (element_type *)0x0;
  local_e8._8_8_ = (undefined8 *)0x0;
  if (!(bool)local_e8._M_pod_data[0]) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_a0,(internal *)local_e8._M_pod_data,
               (AssertionResult *)"aContext.mPS","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
               ,0x6b,(char *)CONCAT71(local_a0.function_mocker_._1_7_,
                                      (char)local_a0.function_mocker_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>_> *)
        CONCAT71(local_a0.function_mocker_._1_7_,(char)local_a0.function_mocker_) !=
        &local_a0.matchers_.
         super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
         .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
         super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
         _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.impl_) {
      operator_delete((undefined1 *)
                      CONCAT71(local_a0.function_mocker_._1_7_,(char)local_a0.function_mocker_));
    }
    if (local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
        _vptr_MatcherBase != (_func_int **)0x0) {
      (**(code **)(*local_100.
                    super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
                    _vptr_MatcherBase + 8))();
    }
  }
  uVar3 = local_e8._8_8_;
  if ((undefined8 *)local_e8._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_e8._8_8_ != (undefined8 *)(local_e8._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_e8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  if (peVar2 != (element_type *)0x0) {
    local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)operator_new(8);
    ((local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherDescriberInterface_002e48d0;
    local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
    _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002e19a0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
              (&local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
                impl_.
                super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
               impl_.
               super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
    _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002e1958;
    local_c8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)operator_new(8);
    ((local_c8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherDescriberInterface_002e4998;
    local_c8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)&PTR__MatcherBase_002e1a08;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
              (&local_c8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               local_c8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    local_c8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)&PTR__MatcherBase_002e19c0;
    CommissionerAppStaticExpecter::gmock_Create
              (&local_a0,&aContext->mCommissionerAppStaticExpecter,&local_100,&local_c8);
    testing::internal::GetWithoutMatchers();
    pTVar6 = testing::internal::
             MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
             ::InternalExpectedAt
                       (&local_a0,
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                        ,0x6c,"aContext.mCommissionerAppStaticExpecter","Create(_, _)");
    pTVar6 = testing::internal::
             TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
             ::Times(pTVar6,1);
    paVar1 = &local_50.mMessage.field_2;
    local_50.mCode = kNone;
    local_50.mMessage._M_string_length = 0;
    local_50.mMessage.field_2._M_local_buf[0] = '\0';
    local_50.mMessage._M_dataplus._M_p = (pointer)paVar1;
    testing::Return<ot::commissioner::Error>((testing *)&local_b0,&local_50);
    local_68 = local_b0;
    local_60 = local_a8;
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_a8->_M_use_count = local_a8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_a8->_M_use_count = local_a8->_M_use_count + 1;
      }
    }
    local_58 = aContext;
    testing::internal::DoAllAction::operator_cast_to_Action
              ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                *)&local_e8,(DoAllAction *)&local_68);
    testing::internal::
    TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
    ::WillOnce(pTVar6,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       *)&local_e8);
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.mMessage._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.mMessage._M_dataplus._M_p);
    }
    local_a0.matchers_.
    super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
    .
    super__Head_base<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_false>
    ._M_head_impl.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
    _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002e19a0;
    if (local_a0.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .
        super__Head_base<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_false>
        ._M_head_impl.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.matchers_.
                 super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                 .
                 super__Head_base<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_false>
                 ._M_head_impl.
                 super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
                 super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_a0.matchers_.
    super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
    .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
    super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>._M_head_impl.
    super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)&PTR__MatcherBase_002e1a08;
    if (local_a0.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
        super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
        _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.matchers_.
                 super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                 .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
                 super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
                 _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_c8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)&PTR__MatcherBase_002e1a08;
    if (local_c8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
    _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002e19a0;
    if (local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
                 impl_.
                 super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    iVar5 = (*(((aContext->mPS).
                super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_PersistentStorage)._vptr_PersistentStorage[2])();
    local_e8._M_pod_data[0] = (char)iVar5;
    local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
    _vptr_MatcherBase =
         (_func_int **)
         ((ulong)local_100.super_MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>.
                 _vptr_MatcherBase & 0xffffffffffffff00);
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
              ((internal *)&local_a0,"aContext.mPS->Open()",
               "persistent_storage::PersistentStorage::Status::kSuccess",
               (Status *)local_e8._M_pod_data,(Status *)&local_100);
    if ((char)local_a0.function_mocker_ == '\0') {
      testing::Message::Message((Message *)&local_e8);
      if (local_a0.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
          .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
          super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
          _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase ==
          (_func_int **)0x0) {
        message = (_func_int *)0x271a25;
      }
      else {
        message = *local_a0.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                   .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
                   super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
                   _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.
                   _vptr_MatcherBase;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x71,(char *)message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if ((long *)CONCAT71(local_e8._1_7_,local_e8._M_pod_data[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_e8._1_7_,local_e8._M_pod_data[0]) + 8))();
      }
    }
    pp_Var4 = local_a0.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
              .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
              super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
              _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase;
    if (local_a0.matchers_.
        super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
        .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
        super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
        _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
        (_func_int **)0x0) {
      if ((_func_int **)
          *local_a0.matchers_.
           super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
           .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
           super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
           _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
          local_a0.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
          .super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>.
          super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>.
          _M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase + 2) {
        operator_delete(*local_a0.matchers_.
                         super__Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                         .
                         super__Tuple_impl<1UL,_testing::Matcher<const_ot::commissioner::Config_&>_>
                         .
                         super__Head_base<1UL,_testing::Matcher<const_ot::commissioner::Config_&>,_false>
                         ._M_head_impl.super_MatcherBase<const_ot::commissioner::Config_&>.
                         _vptr_MatcherBase);
      }
      operator_delete(pp_Var4);
    }
  }
  return;
}

Assistant:

void SetInitialExpectations(TestContext &aContext)
    {
        ASSERT_TRUE(aContext.mPS);
        EXPECT_CALL(aContext.mCommissionerAppStaticExpecter, Create(_, _))
            .Times(1)
            .WillOnce(DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = aContext.mDefaultCommissioner; }),
                            Return(Error{})));

        ASSERT_EQ(aContext.mPS->Open(), persistent_storage::PersistentStorage::Status::kSuccess);
    }